

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::
     DumpElementC<Js::OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCode op,OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  int iVar4;
  bool bVar5;
  PropertyId propertyId;
  ScriptContext *this;
  PropertyRecord *pPVar6;
  undefined4 *puVar7;
  ulong uVar8;
  undefined6 in_register_0000003a;
  char16_t *form;
  
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  propertyId = FunctionBody::GetReferencedPropertyId(dumpFunction,data->PropertyIdIndex);
  pPVar6 = ScriptContext::GetPropertyName(this,propertyId);
  iVar4 = (int)CONCAT62(in_register_0000003a,op);
  uVar8 = (ulong)(iVar4 - 0x118U);
  if (iVar4 - 0x118U < 0x40) {
    if ((0xc00000000000003U >> (uVar8 & 0x3f) & 1) != 0) {
      uVar1 = data->Value;
      uVar2 = data->Instance;
      form = L" R%d.%s = (Set/Get) R%d";
      goto LAB_0074f0ea;
    }
    if (uVar8 == 0x16) goto LAB_0074f0b1;
    if (uVar8 != 0x3f) goto LAB_0074f0a8;
  }
  else {
LAB_0074f0a8:
    if (iVar4 - 0x80U < 4) {
LAB_0074f0b1:
      Output::Print(L" R%d.%s",(ulong)data->Instance,pPVar6 + 1);
      return;
    }
    if (iVar4 != 0xc2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                  ,0x2d4,"(false)","Unknown OpCode for OpLayoutElementC");
      if (bVar5) {
        *puVar7 = 0;
        return;
      }
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
  }
  uVar1 = data->Value;
  uVar2 = data->Instance;
  form = L" R%d.%s = R%d";
LAB_0074f0ea:
  Output::Print(form,(ulong)uVar2,pPVar6 + 1,(ulong)uVar1);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementC(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        ScriptContext* scriptContext = dumpFunction->GetScriptContext();
        PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(
            dumpFunction->GetReferencedPropertyId(data->PropertyIdIndex));
        switch (op)
        {
            case OpCode::DeleteFld:
            case OpCode::DeleteFld_ReuseLoc:
            case OpCode::DeleteRootFld:
            case OpCode::DeleteFldStrict:
            case OpCode::DeleteRootFldStrict:
            {
                Output::Print(_u(" R%d.%s"), data->Instance, pPropertyName->GetBuffer());
                break;
            }
            case OpCode::InitSetFld:
            case OpCode::InitGetFld:
            case OpCode::InitClassMemberGet:
            case OpCode::InitClassMemberSet:
            {
                Output::Print(_u(" R%d.%s = (Set/Get) R%d"), data->Instance, pPropertyName->GetBuffer(),
                        data->Value);
                break;
            }
            case OpCode::StFuncExpr:
            case OpCode::InitProto:
            {
                Output::Print(_u(" R%d.%s = R%d"), data->Instance, pPropertyName->GetBuffer(),
                        data->Value);
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementC");
                break;
            }
        }
    }